

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromecast.h
# Opt level: O0

bool cc::loadMedia(Connection *conn,string *video,double position)

{
  undefined8 __s;
  int __val;
  string *conn_00;
  ulong uVar1;
  string local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator<char> local_49;
  string local_48;
  double local_28;
  double position_local;
  string *video_local;
  Connection *conn_local;
  
  local_28 = position;
  position_local = (double)video;
  video_local = (string *)conn;
  uVar1 = std::__cxx11::string::empty();
  conn_00 = video_local;
  __s = ns::strings._24_8_;
  if ((uVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,(char *)__s,&local_49);
    __val = s_requestId;
    s_requestId = s_requestId + 1;
    std::__cxx11::to_string(&local_140,__val);
    std::operator+(&local_120,"{  \"type\": \"LOAD\",  \"requestId\": ",&local_140);
    std::operator+(&local_100,&local_120,",  \"media\": {   \"contentId\": \"");
    std::operator+(&local_e0,&local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   position_local);
    std::operator+(&local_c0,&local_e0,
                   "\",    \"streamType\": \"BUFFERED\",    \"contentType\": \"x-youtube/video\"  },  \"currentTime\": "
                  );
    std::__cxx11::to_string(&local_160,local_28);
    std::operator+(&local_a0,&local_c0,&local_160);
    std::operator+(&local_80,&local_a0,"}");
    conn_local._7_1_ = sendMessage((Connection *)conn_00,&local_48,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  else {
    puts("Can\'t load empty video");
    conn_local._7_1_ = 0;
  }
  return (bool)(conn_local._7_1_ & 1);
}

Assistant:

bool loadMedia(const Connection &conn, const std::string &video, double position)
{
    if (video.empty()) {
        puts("Can't load empty video");
        return false;
    }
    return sendMessage(conn,
            ns::strings[ns::Media],
            "{ "
            " \"type\": \"LOAD\", "
            " \"requestId\": " + std::to_string(s_requestId++) + ", "
            " \"media\": {"
            "   \"contentId\": \"" + video + "\", "
            "   \"streamType\": \"BUFFERED\", "
            "   \"contentType\": \"x-youtube/video\" "
            " }, "
            " \"currentTime\": " + std::to_string(position) +
            "}"
        );
}